

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yuv_sse2.c
# Opt level: O2

void VP8YuvToRgb56532_SSE2(uint8_t *y,uint8_t *u,uint8_t *v,uint8_t *dst)

{
  ulong uVar1;
  ushort uVar2;
  undefined1 auVar8 [16];
  ushort uVar9;
  undefined1 auVar16 [16];
  undefined1 auVar17 [15];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  __m128i B;
  __m128i G;
  __m128i R;
  short local_68;
  short sStack_66;
  short sStack_64;
  short sStack_62;
  short sStack_60;
  short sStack_5e;
  short sStack_5c;
  short sStack_5a;
  short local_58;
  short sStack_56;
  short sStack_54;
  short sStack_52;
  short sStack_50;
  short sStack_4e;
  short sStack_4c;
  short sStack_4a;
  short local_48;
  short sStack_46;
  short sStack_44;
  short sStack_42;
  short sStack_40;
  short sStack_3e;
  short sStack_3c;
  short sStack_3a;
  undefined4 uVar3;
  undefined6 uVar4;
  undefined8 uVar5;
  undefined1 auVar6 [12];
  undefined1 auVar7 [14];
  undefined4 uVar10;
  undefined6 uVar11;
  undefined8 uVar12;
  undefined1 auVar13 [12];
  undefined1 auVar14 [14];
  undefined1 auVar15 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  
  for (uVar1 = 0; uVar1 < 0x20; uVar1 = uVar1 + 8) {
    YUV444ToRGB_SSE2(y + uVar1,u + uVar1,v + uVar1,(__m128i *)&local_48,(__m128i *)&local_58,
                     (__m128i *)&local_68);
    auVar17[1] = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    auVar17[0] = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
    auVar17[2] = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    auVar17[3] = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
    auVar17[4] = (0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 - (0xff < sStack_40);
    auVar17[5] = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
    auVar17[6] = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
    auVar17[7] = (0 < sStack_3a) * (sStack_3a < 0x100) * (char)sStack_3a - (0xff < sStack_3a);
    auVar17[8] = (0 < local_48) * (local_48 < 0x100) * (char)local_48 - (0xff < local_48);
    auVar17[9] = (0 < sStack_46) * (sStack_46 < 0x100) * (char)sStack_46 - (0xff < sStack_46);
    auVar17[10] = (0 < sStack_44) * (sStack_44 < 0x100) * (char)sStack_44 - (0xff < sStack_44);
    auVar17[0xb] = (0 < sStack_42) * (sStack_42 < 0x100) * (char)sStack_42 - (0xff < sStack_42);
    auVar17[0xc] = (0 < sStack_40) * (sStack_40 < 0x100) * (char)sStack_40 - (0xff < sStack_40);
    auVar17[0xd] = (0 < sStack_3e) * (sStack_3e < 0x100) * (char)sStack_3e - (0xff < sStack_3e);
    auVar17[0xe] = (0 < sStack_3c) * (sStack_3c < 0x100) * (char)sStack_3c - (0xff < sStack_3c);
    uVar2 = CONCAT11((0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56),
                     (0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58));
    uVar3 = CONCAT13((0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52),
                     CONCAT12((0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 -
                              (0xff < sStack_54),uVar2));
    uVar4 = CONCAT15((0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e),
                     CONCAT14((0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 -
                              (0xff < sStack_50),uVar3));
    uVar5 = CONCAT17((0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a),
                     CONCAT16((0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c -
                              (0xff < sStack_4c),uVar4));
    auVar6._0_10_ =
         CONCAT19((0 < sStack_56) * (sStack_56 < 0x100) * (char)sStack_56 - (0xff < sStack_56),
                  CONCAT18((0 < local_58) * (local_58 < 0x100) * (char)local_58 - (0xff < local_58),
                           uVar5));
    auVar6[10] = (0 < sStack_54) * (sStack_54 < 0x100) * (char)sStack_54 - (0xff < sStack_54);
    auVar6[0xb] = (0 < sStack_52) * (sStack_52 < 0x100) * (char)sStack_52 - (0xff < sStack_52);
    auVar7[0xc] = (0 < sStack_50) * (sStack_50 < 0x100) * (char)sStack_50 - (0xff < sStack_50);
    auVar7._0_12_ = auVar6;
    auVar7[0xd] = (0 < sStack_4e) * (sStack_4e < 0x100) * (char)sStack_4e - (0xff < sStack_4e);
    auVar8[0xe] = (0 < sStack_4c) * (sStack_4c < 0x100) * (char)sStack_4c - (0xff < sStack_4c);
    auVar8._0_14_ = auVar7;
    auVar8[0xf] = (0 < sStack_4a) * (sStack_4a < 0x100) * (char)sStack_4a - (0xff < sStack_4a);
    uVar9 = CONCAT11((0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66),
                     (0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68));
    uVar10 = CONCAT13((0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62),
                      CONCAT12((0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 -
                               (0xff < sStack_64),uVar9));
    uVar11 = CONCAT15((0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e),
                      CONCAT14((0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 -
                               (0xff < sStack_60),uVar10));
    uVar12 = CONCAT17((0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a),
                      CONCAT16((0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c -
                               (0xff < sStack_5c),uVar11));
    auVar13._0_10_ =
         CONCAT19((0 < sStack_66) * (sStack_66 < 0x100) * (char)sStack_66 - (0xff < sStack_66),
                  CONCAT18((0 < local_68) * (local_68 < 0x100) * (char)local_68 - (0xff < local_68),
                           uVar12));
    auVar13[10] = (0 < sStack_64) * (sStack_64 < 0x100) * (char)sStack_64 - (0xff < sStack_64);
    auVar13[0xb] = (0 < sStack_62) * (sStack_62 < 0x100) * (char)sStack_62 - (0xff < sStack_62);
    auVar14[0xc] = (0 < sStack_60) * (sStack_60 < 0x100) * (char)sStack_60 - (0xff < sStack_60);
    auVar14._0_12_ = auVar13;
    auVar14[0xd] = (0 < sStack_5e) * (sStack_5e < 0x100) * (char)sStack_5e - (0xff < sStack_5e);
    auVar15[0xe] = (0 < sStack_5c) * (sStack_5c < 0x100) * (char)sStack_5c - (0xff < sStack_5c);
    auVar15._0_14_ = auVar14;
    auVar15[0xf] = (0 < sStack_5a) * (sStack_5a < 0x100) * (char)sStack_5a - (0xff < sStack_5a);
    auVar16._0_2_ = uVar9 >> 3;
    auVar16._2_2_ = (ushort)((uint)uVar10 >> 0x13);
    auVar16._4_2_ = (ushort)((uint6)uVar11 >> 0x23);
    auVar16._6_2_ = (ushort)((ulong)uVar12 >> 0x33);
    auVar16._8_2_ = (ushort)((unkuint10)auVar13._0_10_ >> 0x43);
    auVar16._10_2_ = auVar13._10_2_ >> 3;
    auVar16._12_2_ = auVar14._12_2_ >> 3;
    auVar16._14_2_ = auVar15._14_2_ >> 3;
    auVar18._0_2_ = uVar2 >> 5;
    auVar18._2_2_ = (ushort)((uint)uVar3 >> 0x15);
    auVar18._4_2_ = (ushort)((uint6)uVar4 >> 0x25);
    auVar18._6_2_ = (ushort)((ulong)uVar5 >> 0x35);
    auVar18._8_2_ = (ushort)((unkuint10)auVar6._0_10_ >> 0x45);
    auVar18._10_2_ = auVar6._10_2_ >> 5;
    auVar18._12_2_ = auVar7._12_2_ >> 5;
    auVar18._14_2_ = auVar8._14_2_ >> 5;
    auVar17 = auVar18._0_15_ & DAT_001a9130._0_15_ | auVar17 & DAT_001a9120._0_15_;
    auVar8 = psllw(auVar8,3);
    auVar8 = auVar8 & _DAT_001a9140 | auVar16 & _DAT_001a91b0;
    auVar26._0_14_ = auVar17._0_14_;
    auVar26[0xe] = auVar17[7];
    auVar26[0xf] = auVar8[7];
    auVar25._14_2_ = auVar26._14_2_;
    auVar25._0_13_ = auVar17._0_13_;
    auVar25[0xd] = auVar8[6];
    auVar24._13_3_ = auVar25._13_3_;
    auVar24._0_12_ = auVar17._0_12_;
    auVar24[0xc] = auVar17[6];
    auVar23._12_4_ = auVar24._12_4_;
    auVar23._0_11_ = auVar17._0_11_;
    auVar23[0xb] = auVar8[5];
    auVar22._11_5_ = auVar23._11_5_;
    auVar22._0_10_ = auVar17._0_10_;
    auVar22[10] = auVar17[5];
    auVar21._10_6_ = auVar22._10_6_;
    auVar21._0_9_ = auVar17._0_9_;
    auVar21[9] = auVar8[4];
    auVar20._9_7_ = auVar21._9_7_;
    auVar20._0_8_ = auVar17._0_8_;
    auVar20[8] = auVar17[4];
    auVar19._8_8_ = auVar20._8_8_;
    auVar19[7] = auVar8[3];
    auVar19[6] = auVar17[3];
    auVar19[5] = auVar8[2];
    auVar19[4] = auVar17[2];
    auVar19[3] = auVar8[1];
    auVar19[2] = auVar17[1];
    auVar19[0] = auVar17[0];
    auVar19[1] = auVar8[0];
    *(undefined1 (*) [16])(dst + uVar1 * 2) = auVar19;
  }
  return;
}

Assistant:

void VP8YuvToRgb56532_SSE2(const uint8_t* WEBP_RESTRICT y,
                           const uint8_t* WEBP_RESTRICT u,
                           const uint8_t* WEBP_RESTRICT v,
                           uint8_t* WEBP_RESTRICT dst) {
  int n;
  for (n = 0; n < 32; n += 8, dst += 16) {
    __m128i R, G, B;
    YUV444ToRGB_SSE2(y + n, u + n, v + n, &R, &G, &B);
    PackAndStore565_SSE2(&R, &G, &B, dst);
  }
}